

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMIPSAssembly.cpp
# Opt level: O2

void generatePrintMIPSIml(function *fn,string *varName)

{
  int __val;
  bool bVar1;
  varType vVar2;
  tokenCategory tVar3;
  int iVar4;
  size_type sVar5;
  mapped_type *__rhs;
  function *this;
  string local_6a8;
  string varName1;
  string local_668;
  function local_648;
  
  this = (function *)&local_6a8;
  getRealName(&varName1,varName,'[');
  vVar2 = whatIsThisShit(&varName1,fn);
  iVar4 = 1;
  __val = 0xb;
  switch(vVar2) {
  case STR_VAR:
    std::__cxx11::to_string(&local_6a8,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "li $v0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::substr((ulong)&local_6a8,(ulong)&varName1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "la $a0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    break;
  case LOCAL_VAR:
    function::getToken((Identifier *)&local_648,fn,&varName1);
    tVar3 = tokenType::getTokenCategory(&local_648.super_tokenType);
    goto LAB_0011ea53;
  case GLOBAL_VAR:
    identityTable::getToken((Identifier *)&local_648,&globalTable,&varName1);
    tVar3 = tokenType::getTokenCategory(&local_648.super_tokenType);
LAB_0011ea53:
    Identifier::~Identifier((Identifier *)&local_648);
    if (tVar3 == INTTK) {
      __val = iVar4;
    }
    std::__cxx11::to_string(&local_6a8,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "li $v0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_6a8);
    getValueOfVar(&local_6a8,varName,fn);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "addu $a0 $0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    break;
  case TEMP_VAR:
    sVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&charTypeTempVar_abi_cxx11_,varName);
    if (sVar5 == 0) {
      __val = iVar4;
    }
    std::__cxx11::to_string(&local_6a8,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "li $v0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_6a8);
    bVar1 = function::varHasReg(fn,&varName1);
    if (bVar1) {
      local_6a8._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&varName1,true);
      __rhs = std::
              map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&reg2str_abi_cxx11_,(key_type *)&local_6a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648
                     ,"addu $a0 $0 ",__rhs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
      this = &local_648;
    }
    else {
      iVar4 = function::getOffsetOfTemp(fn,&varName1,true);
      std::__cxx11::to_string(&local_668,iVar4);
      std::operator+(&local_6a8,"lw $a0 ",&local_668);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648
                     ,&local_6a8,"($sp)");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_6a8);
      this = (function *)&local_668;
    }
    goto LAB_0011ec06;
  default:
    goto switchD_0011e893_caseD_5;
  case CHARACTER:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "addu $a0 $0 ",varName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::to_string(&local_6a8,0xb);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "li $v0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    break;
  case INTEGER:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "addu $a0 $0 ",varName);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::to_string(&local_6a8,1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "li $v0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
    break;
  case RET_VAL:
    std::__cxx11::string::substr((ulong)&local_6a8,(ulong)varName);
    functionTable::getToken(&local_648,&functions,&local_6a8);
    tVar3 = tokenType::getTokenCategory(&local_648.super_tokenType);
    function::~function(&local_648);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[16]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [16])"addu $a0 $0 $v0");
    if (tVar3 == INTTK) {
      __val = iVar4;
    }
    std::__cxx11::to_string(&local_6a8,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648,
                   "li $v0 ",&local_6a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648);
  }
  std::__cxx11::string::~string((string *)&local_648);
LAB_0011ec06:
  std::__cxx11::string::~string((string *)this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &mipsCode_abi_cxx11_,(char (*) [8])"syscall");
switchD_0011e893_caseD_5:
  std::__cxx11::string::~string((string *)&varName1);
  return;
}

Assistant:

void generatePrintMIPSIml(function &fn, string &varName) {
    string varName1 = getRealName(varName, '[');
    varType type = whatIsThisShit(varName1, fn);
    int service;
    switch (type) {
        case TEMP_VAR: {
            if (charTypeTempVar.count(varName) != 0)
                service = syscallService[PRINT_CHAR];
            else
                service = syscallService[PRINT_INT];
            mipsCode.emplace_back("li $v0 " + to_string(service));
            if (fn.varHasReg(varName1)) {//寄存器里有值
                mipsCode.emplace_back("addu $a0 $0 " + reg2str.at(fn.getRegOfVar(varName1, true)));
            } else {//栈里有值
                int offset = fn.getOffsetOfTemp(varName1, true);
                mipsCode.emplace_back("lw $a0 " + to_string(offset) + "($sp)");
            }
            mipsCode.emplace_back("syscall");
            break;
        }
        case STR_VAR: {
            service = syscallService[PRINT_STR];
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("la $a0 " + varName1.substr(1, varName1.length() - 1));
            mipsCode.emplace_back("syscall");
            break;
        }
        case LOCAL_VAR:
        case GLOBAL_VAR: {
            if (type == LOCAL_VAR) {
                if (fn.getToken(varName1).getTokenCategory() == INTTK)
                    service = syscallService[PRINT_INT];
                else
                    service = service = syscallService[PRINT_CHAR];
            } else {
                if (globalTable.getToken(varName1).getTokenCategory() == INTTK)
                    service = syscallService[PRINT_INT];
                else
                    service = service = syscallService[PRINT_CHAR];
            }
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("addu $a0 $0 " + getValueOfVar(varName, fn));
            mipsCode.emplace_back("syscall");
            break;
        }
        case RET_VAL: {
            if (functions.getToken(varName.substr(5, varName.size() - 5)).getTokenCategory() == INTTK)
                service = syscallService[PRINT_INT];
            else
                service = service = syscallService[PRINT_CHAR];
            mipsCode.emplace_back("addu $a0 $0 $v0");
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        case INTEGER: {
            service = syscallService[PRINT_INT];
            mipsCode.emplace_back("addu $a0 $0 " + varName);
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        case CHARACTER: {
            service = syscallService[PRINT_CHAR];
            mipsCode.emplace_back("addu $a0 $0 " + varName);
            mipsCode.emplace_back("li $v0 " + to_string(service));
            mipsCode.emplace_back("syscall");
            break;
        }
        default:
            break;
    }
}